

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O3

bool __thiscall Gluco::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  int64_t *piVar1;
  vec<Gluco::Lit> *out_clause;
  uint *puVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  vec<unsigned_int> *pvVar10;
  vec<unsigned_int> *pvVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this_00;
  vec<Gluco::Solver::Watcher> *pvVar15;
  vec<Gluco::Solver::Watcher> *pvVar16;
  int clause_size;
  int local_94;
  Var local_90;
  uint local_8c;
  vec<unsigned_int> local_88;
  vec<unsigned_int> local_78;
  int local_5c;
  vec<unsigned_int> *local_58;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *local_50;
  long local_48;
  uint *local_40;
  uint *local_38;
  
  lVar7 = (long)v;
  local_94 = v;
  local_90 = v;
  if ((this->frozen).data[lVar7] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f1,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  if ((0 < (this->eliminated).sz) && ((this->eliminated).data[lVar7] != '\0')) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f2,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  if (((this->super_Solver).assigns.data[lVar7].value & 2) == 0) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,499,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  this_00 = &this->occurs;
  if ((this->occurs).dirty.data[lVar7] != '\0') {
    OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
              (this_00,&local_94);
    local_90 = local_94;
    lVar7 = (long)local_94;
  }
  pvVar11 = (this_00->occs).data;
  pvVar10 = pvVar11 + lVar7;
  local_78.data = (uint *)0x0;
  local_78.sz = 0;
  local_78.cap = 0;
  local_88.data = (uint *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  local_94 = local_90;
  if (0 < pvVar11[lVar7].sz) {
    lVar7 = 0;
    do {
      uVar6 = pvVar10->data[lVar7];
      if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar6)
      goto LAB_005ce964;
      puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar8 = *(ulong *)(puVar2 + uVar6) >> 0x20;
      pvVar11 = &local_88;
      if ((0 < (int)(*(ulong *)(puVar2 + uVar6) >> 0x20)) &&
         (pvVar11 = &local_78, puVar2[(ulong)uVar6 + 3] != local_94 * 2)) {
        lVar13 = 0;
        do {
          lVar12 = lVar13;
          if (uVar8 - 1 == lVar12) break;
          lVar13 = lVar12 + 1;
        } while (puVar2[(ulong)uVar6 + lVar12 + 4] != local_94 * 2);
        pvVar11 = &local_88;
        if (lVar12 + 1U < uVar8) {
          pvVar11 = &local_78;
        }
      }
      vec<unsigned_int>::push(pvVar11,pvVar10->data + lVar7);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pvVar10->sz);
    local_48 = (long)local_78.sz;
    local_90 = local_94;
    local_5c = 0;
    if (0 < local_48) {
      iVar5 = local_88.sz;
      uVar8 = local_88._8_8_ & 0xffffffff;
      local_38 = local_78.data;
      local_40 = local_88.data;
      lVar7 = 0;
      iVar9 = 0;
      local_58 = pvVar10;
      local_50 = this_00;
      do {
        if (0 < iVar5) {
          uVar14 = 0;
          do {
            uVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz;
            if ((uVar6 <= local_38[lVar7]) || (uVar6 <= local_40[uVar14])) goto LAB_005ce964;
            puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            bVar4 = merge(this,(Clause *)(puVar2 + local_38[lVar7]),
                          (Clause *)(puVar2 + local_40[uVar14]),local_90,&local_5c);
            if (bVar4) {
              bVar4 = true;
              if (this->grow + local_58->sz <= iVar9) goto LAB_005ce924;
              iVar9 = iVar9 + 1;
              if ((this->clause_lim != -1) && (this->clause_lim < local_5c)) goto LAB_005ce924;
            }
            uVar14 = uVar14 + 1;
          } while (uVar8 != uVar14);
        }
        lVar7 = lVar7 + 1;
        pvVar10 = local_58;
        this_00 = local_50;
      } while (lVar7 != local_48);
    }
  }
  (this->eliminated).data[local_90] = '\x01';
  lVar7 = (long)local_94;
  pcVar3 = (this->super_Solver).decision.data;
  if (pcVar3[lVar7] != '\0') {
    piVar1 = &(this->super_Solver).dec_vars;
    *piVar1 = *piVar1 + -1;
  }
  pcVar3[lVar7] = '\0';
  if ((((this->super_Solver).order_heap.indices.sz <= local_94) ||
      ((this->super_Solver).order_heap.indices.data[lVar7] < 0)) &&
     ((this->super_Solver).decision.data[lVar7] != '\0')) {
    Heap<Gluco::Solver::VarOrderLt>::insert(&(this->super_Solver).order_heap,local_94);
  }
  this->eliminated_vars = this->eliminated_vars + 1;
  if (local_88.sz < local_78.sz) {
    if (0 < local_88.sz) {
      lVar7 = 0;
      do {
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= local_88.data[lVar7])
        {
LAB_005ce964:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        mkElimClause(&this->elimclauses,local_94,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_88.data[lVar7]));
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_88.sz);
    }
    local_8c = local_94 * 2;
    vec<unsigned_int>::push(&this->elimclauses,&local_8c);
    local_8c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_8c);
    this->eliminated_clauses = this->eliminated_clauses + local_88.sz;
  }
  else {
    if (0 < local_78.sz) {
      lVar7 = 0;
      do {
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= local_78.data[lVar7])
        goto LAB_005ce964;
        mkElimClause(&this->elimclauses,local_94,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_78.data[lVar7]));
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_78.sz);
    }
    local_8c = local_94 * 2 + 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_8c);
    local_8c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_8c);
    this->eliminated_clauses = this->eliminated_clauses + local_78.sz;
  }
  if (0 < local_78.sz) {
    out_clause = &(this->super_Solver).add_tmp;
    uVar8 = local_88._8_8_ & 0xffffffff;
    lVar7 = 0;
    iVar5 = local_78.sz;
    do {
      if (0 < (int)uVar8) {
        lVar13 = 0;
        do {
          uVar6 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz;
          if ((uVar6 <= local_78.data[lVar7]) || (uVar6 <= local_88.data[lVar13]))
          goto LAB_005ce964;
          puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar4 = merge(this,(Clause *)(puVar2 + local_78.data[lVar7]),
                        (Clause *)(puVar2 + local_88.data[lVar13]),local_94,out_clause);
          if ((bVar4) && (bVar4 = addClause_(this,out_clause), !bVar4)) {
            bVar4 = false;
            goto LAB_005ce924;
          }
          lVar13 = lVar13 + 1;
          uVar8 = (ulong)local_88.sz;
        } while (lVar13 < (long)uVar8);
        iVar5 = local_78.sz;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  if (0 < pvVar10->sz) {
    lVar7 = 0;
    do {
      removeClause(this,pvVar10->data[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pvVar10->sz);
  }
  pvVar10 = (this_00->occs).data;
  puVar2 = pvVar10[local_94].data;
  if (puVar2 != (uint *)0x0) {
    pvVar10 = pvVar10 + local_94;
    pvVar10->sz = 0;
    free(puVar2);
    pvVar10->data = (uint *)0x0;
    pvVar10->cap = 0;
  }
  uVar6 = local_94 * 2;
  pvVar15 = (this->super_Solver).watches.occs.data;
  if (pvVar15[(int)uVar6].sz == 0) {
    pvVar16 = pvVar15 + (int)uVar6;
    if (pvVar16->data != (Watcher *)0x0) {
      pvVar16->sz = 0;
      free(pvVar16->data);
      pvVar16->data = (Watcher *)0x0;
      pvVar16->cap = 0;
      pvVar15 = (this->super_Solver).watches.occs.data;
      uVar6 = local_94 * 2;
    }
  }
  if (pvVar15[(int)(uVar6 | 1)].sz == 0) {
    pvVar15 = pvVar15 + (int)(uVar6 | 1);
    if (pvVar15->data != (Watcher *)0x0) {
      pvVar15->sz = 0;
      free(pvVar15->data);
      pvVar15->data = (Watcher *)0x0;
      pvVar15->cap = 0;
    }
  }
  bVar4 = backwardSubsumptionCheck(this,false);
LAB_005ce924:
  if (local_88.data != (uint *)0x0) {
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    free(local_88.data);
  }
  if (local_78.data != (uint *)0x0) {
    local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
    free(local_78.data);
  }
  return bVar4;
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    int i, j;
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        eliminated_clauses += neg.size();
    }else{
        for (i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        eliminated_clauses += pos.size();
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}